

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageViewTests.cpp
# Opt level: O1

TestCaseGroup * vkt::pipeline::createImageViewTests(TestContext *testCtx)

{
  VkImageViewType viewType;
  VkFormat format;
  _Alloc_hider name;
  TestNode *this;
  pointer pVVar1;
  TestCaseGroup *node;
  bool bVar2;
  int channelNdx;
  TestNode *this_00;
  long *plVar3;
  char *pcVar4;
  long lVar5;
  TestNode *pTVar6;
  ImageViewTest *this_01;
  ostream *poVar7;
  size_type *psVar8;
  VkComponentSwizzle componentSwizzle;
  VkComponentSwizzle componentSwizzle_00;
  VkComponentSwizzle componentSwizzle_01;
  VkComponentSwizzle componentSwizzle_02;
  int firstChannelNdx;
  deUint32 dVar9;
  long lVar10;
  ulong uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  VkComponentSwizzle currentChannel [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  TestNode *local_2c0;
  TestContext *local_2b8;
  string local_2b0;
  TestNode *local_290;
  TestNode *local_288;
  TestNode *local_280;
  vector<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_> componentMappings;
  long local_248;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> subresourceRangeTests;
  string local_228;
  string local_208;
  long local_1e8;
  long *local_1e0;
  long local_1d0 [2];
  VkImageSubresourceRange subresourceRange;
  string fullName;
  ios_base local_138 [264];
  
  this_00 = (TestNode *)operator_new(0x70);
  local_2b8 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_00,testCtx,"image_view","Image tests");
  local_2c0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_2c0,local_2b8,"view_type","");
  lVar10 = 0;
  do {
    viewType = (&DAT_00d21cf0)[lVar10 * 4];
    local_290 = (TestNode *)operator_new(0x70);
    pcVar4 = (char *)(&DAT_00d21cf8)[lVar10 * 2];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"Uses a ","");
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    currentChannel._0_8_ = &local_2d8;
    psVar8 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar8) {
      local_2d8._M_allocated_capacity = *psVar8;
      local_2d8._8_8_ = plVar3[3];
    }
    else {
      local_2d8._M_allocated_capacity = *psVar8;
      currentChannel._0_8_ = (size_type *)*plVar3;
    }
    currentChannel._8_8_ = plVar3[1];
    *plVar3 = (long)psVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)currentChannel);
    psVar8 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar8) {
      fullName.field_2._M_allocated_capacity = *psVar8;
      fullName.field_2._8_8_ = plVar3[3];
      fullName._M_dataplus._M_p = (pointer)&fullName.field_2;
    }
    else {
      fullName.field_2._M_allocated_capacity = *psVar8;
      fullName._M_dataplus._M_p = (pointer)*plVar3;
    }
    fullName._M_string_length = plVar3[1];
    *plVar3 = (long)psVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_290,local_2b8,pcVar4,fullName._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fullName._M_dataplus._M_p != &fullName.field_2) {
      operator_delete(fullName._M_dataplus._M_p,fullName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)currentChannel._0_8_ != &local_2d8) {
      operator_delete((void *)currentChannel._0_8_,local_2d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    local_288 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_288,local_2b8,"format","Uses samplable formats");
    local_248 = 0;
    local_1e8 = lVar10;
    do {
      lVar10 = local_1e8;
      paVar12 = &fullName.field_2;
      format = *(VkFormat *)(&DAT_00ae1f80 + local_248 * 4);
      bVar2 = ::vk::isCompressedFormat(format);
      if (bVar2 && (viewType & ~VK_IMAGE_VIEW_TYPE_1D_ARRAY) == VK_IMAGE_VIEW_TYPE_1D) break;
      local_280 = (TestNode *)operator_new(0x70);
      pcVar4 = ::vk::getFormatName(format);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fullName,pcVar4,(allocator<char> *)currentChannel);
      std::__cxx11::string::substr((ulong)currentChannel,(ulong)&fullName);
      de::toLower(&local_2b0,(string *)currentChannel);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)currentChannel._0_8_ != &local_2d8) {
        operator_delete((void *)currentChannel._0_8_,local_2d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fullName._M_dataplus._M_p != paVar12) {
        operator_delete(fullName._M_dataplus._M_p,fullName.field_2._M_allocated_capacity + 1);
      }
      name._M_p = local_2b0._M_dataplus._M_p;
      currentChannel._0_8_ = &local_2d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)currentChannel,"Samples a texture of format ","");
      ::vk::getFormatName(format);
      plVar3 = (long *)std::__cxx11::string::append((char *)currentChannel);
      psVar8 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar8) {
        fullName.field_2._M_allocated_capacity = *psVar8;
        fullName.field_2._8_8_ = plVar3[3];
        fullName._M_dataplus._M_p = (pointer)paVar12;
      }
      else {
        fullName.field_2._M_allocated_capacity = *psVar8;
        fullName._M_dataplus._M_p = (pointer)*plVar3;
      }
      fullName._M_string_length = plVar3[1];
      *plVar3 = (long)psVar8;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_280,local_2b8,name._M_p,fullName._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fullName._M_dataplus._M_p != paVar12) {
        operator_delete(fullName._M_dataplus._M_p,fullName.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)currentChannel._0_8_ != &local_2d8) {
        operator_delete((void *)currentChannel._0_8_,local_2d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      anon_unknown_1::createSubresourceRangeTests(&subresourceRangeTests,local_2b8,viewType,format);
      dVar9 = 0;
      if (viewType < VK_IMAGE_VIEW_TYPE_LAST) {
        dVar9 = *(deUint32 *)(&DAT_00ae2184 + (ulong)viewType * 4);
      }
      subresourceRange.aspectMask = 1;
      subresourceRange.baseMipLevel = 0;
      subresourceRange.levelCount = anon_unknown_1::ImageViewTest::getNumLevels(viewType);
      subresourceRange.baseArrayLayer = 0;
      componentMappings.
      super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      componentMappings.
      super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      componentMappings.
      super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      fullName._M_dataplus._M_p = (pointer)0x400000003;
      fullName._M_string_length = 0x600000005;
      lVar10 = 0;
      subresourceRange.layerCount = dVar9;
      do {
        lVar5 = 0;
        do {
          currentChannel[lVar5] =
               *(VkComponentSwizzle *)
                ((long)&fullName._M_dataplus._M_p + (ulong)((int)lVar10 + (int)lVar5 & 3) * 4);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        local_2b0._M_dataplus._M_p = (pointer)currentChannel._0_8_;
        local_2b0._M_string_length._0_4_ = currentChannel[2];
        local_2b0._M_string_length._4_4_ = currentChannel[3];
        if (componentMappings.
            super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            componentMappings.
            super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vk::VkComponentMapping,std::allocator<vk::VkComponentMapping>>::
          _M_realloc_insert<vk::VkComponentMapping_const&>
                    ((vector<vk::VkComponentMapping,std::allocator<vk::VkComponentMapping>> *)
                     &componentMappings,
                     (iterator)
                     componentMappings.
                     super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(VkComponentMapping *)&local_2b0);
        }
        else {
          (componentMappings.
           super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>.
           _M_impl.super__Vector_impl_data._M_finish)->r = currentChannel[0];
          (componentMappings.
           super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>.
           _M_impl.super__Vector_impl_data._M_finish)->g = currentChannel[1];
          (componentMappings.
           super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>.
           _M_impl.super__Vector_impl_data._M_finish)->b = currentChannel[2];
          (componentMappings.
           super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>.
           _M_impl.super__Vector_impl_data._M_finish)->a = currentChannel[3];
          componentMappings.
          super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               componentMappings.
               super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      pTVar6 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar6,local_2b8,"component_swizzle","");
      if (componentMappings.
          super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          componentMappings.
          super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        lVar10 = 0;
        uVar11 = 0;
        do {
          pVVar1 = componentMappings.
                   super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          this_01 = (ImageViewTest *)operator_new(0xa0);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&fullName);
          (anonymous_namespace)::getComponentSwizzleCaseName_abi_cxx11_
                    ((string *)currentChannel,
                     (_anonymous_namespace_ *)(ulong)*(uint *)((long)&pVVar1->r + lVar10),
                     componentSwizzle);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&fullName,(char *)currentChannel._0_8_,currentChannel._8_8_
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
          (anonymous_namespace)::getComponentSwizzleCaseName_abi_cxx11_
                    (&local_2b0,(_anonymous_namespace_ *)(ulong)*(uint *)((long)&pVVar1->g + lVar10)
                     ,componentSwizzle_00);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
          (anonymous_namespace)::getComponentSwizzleCaseName_abi_cxx11_
                    (&local_208,(_anonymous_namespace_ *)(ulong)*(uint *)((long)&pVVar1->b + lVar10)
                     ,componentSwizzle_01);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_208._M_dataplus._M_p,local_208._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
          (anonymous_namespace)::getComponentSwizzleCaseName_abi_cxx11_
                    (&local_228,(_anonymous_namespace_ *)(ulong)*(uint *)((long)&pVVar1->a + lVar10)
                     ,componentSwizzle_02);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,local_228._M_dataplus._M_p,local_228._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) {
            operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)currentChannel._0_8_ != &local_2d8) {
            operator_delete((void *)currentChannel._0_8_,local_2d8._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fullName);
          std::ios_base::~ios_base(local_138);
          anon_unknown_1::ImageViewTest::ImageViewTest
                    (this_01,local_2b8,(char *)local_1e0,"",viewType,format,0.0,
                     (VkComponentMapping *)
                     ((long)&(componentMappings.
                              super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                              ._M_impl.super__Vector_impl_data._M_start)->r + lVar10),
                     &subresourceRange);
          tcu::TestNode::addChild(pTVar6,(TestNode *)this_01);
          if (local_1e0 != local_1d0) {
            operator_delete(local_1e0,local_1d0[0] + 1);
          }
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 0x10;
        } while (uVar11 < (ulong)((long)componentMappings.
                                        super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)componentMappings.
                                        super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      if (componentMappings.
          super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(componentMappings.
                        super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)componentMappings.
                              super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)componentMappings.
                              super__Vector_base<vk::VkComponentMapping,_std::allocator<vk::VkComponentMapping>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      this = local_280;
      tcu::TestNode::addChild(local_280,pTVar6);
      node = subresourceRangeTests.
             super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
             ptr;
      subresourceRangeTests.
      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
           (TestCaseGroup *)0x0;
      tcu::TestNode::addChild(this,&node->super_TestNode);
      tcu::TestNode::addChild(local_288,this);
      local_248 = local_248 + 1;
      lVar10 = local_1e8;
    } while (local_248 != 0x75);
    pTVar6 = local_290;
    tcu::TestNode::addChild(local_290,local_288);
    tcu::TestNode::addChild(local_2c0,pTVar6);
    lVar10 = lVar10 + 1;
    if (lVar10 == 7) {
      tcu::TestNode::addChild(this_00,local_2c0);
      return (TestCaseGroup *)this_00;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createImageViewTests (tcu::TestContext& testCtx)
{
	const struct
	{
		VkImageViewType		type;
		const char*			name;
	}
	imageViewTypes[] =
	{
		{ VK_IMAGE_VIEW_TYPE_1D,			"1d" },
		{ VK_IMAGE_VIEW_TYPE_1D_ARRAY,		"1d_array" },
		{ VK_IMAGE_VIEW_TYPE_2D,			"2d" },
		{ VK_IMAGE_VIEW_TYPE_2D_ARRAY,		"2d_array" },
		{ VK_IMAGE_VIEW_TYPE_3D,			"3d" },
		{ VK_IMAGE_VIEW_TYPE_CUBE,			"cube" },
		{ VK_IMAGE_VIEW_TYPE_CUBE_ARRAY,	"cube_array" }
	};

	const VkFormat formats[] =
	{
		VK_FORMAT_R4G4_UNORM_PACK8,
		VK_FORMAT_R4G4B4A4_UNORM_PACK16,
		VK_FORMAT_R5G6B5_UNORM_PACK16,
		VK_FORMAT_R5G5B5A1_UNORM_PACK16,
		VK_FORMAT_R8_UNORM,
		VK_FORMAT_R8_SNORM,
		VK_FORMAT_R8_USCALED,
		VK_FORMAT_R8_SSCALED,
		VK_FORMAT_R8_UINT,
		VK_FORMAT_R8_SINT,
		VK_FORMAT_R8_SRGB,
		VK_FORMAT_R8G8_UNORM,
		VK_FORMAT_R8G8_SNORM,
		VK_FORMAT_R8G8_USCALED,
		VK_FORMAT_R8G8_SSCALED,
		VK_FORMAT_R8G8_UINT,
		VK_FORMAT_R8G8_SINT,
		VK_FORMAT_R8G8_SRGB,
		VK_FORMAT_R8G8B8_UNORM,
		VK_FORMAT_R8G8B8_SNORM,
		VK_FORMAT_R8G8B8_USCALED,
		VK_FORMAT_R8G8B8_SSCALED,
		VK_FORMAT_R8G8B8_UINT,
		VK_FORMAT_R8G8B8_SINT,
		VK_FORMAT_R8G8B8_SRGB,
		VK_FORMAT_R8G8B8A8_UNORM,
		VK_FORMAT_R8G8B8A8_SNORM,
		VK_FORMAT_R8G8B8A8_USCALED,
		VK_FORMAT_R8G8B8A8_SSCALED,
		VK_FORMAT_R8G8B8A8_UINT,
		VK_FORMAT_R8G8B8A8_SINT,
		VK_FORMAT_R8G8B8A8_SRGB,
		VK_FORMAT_A2R10G10B10_UNORM_PACK32,
		VK_FORMAT_A2R10G10B10_UINT_PACK32,
		VK_FORMAT_A2B10G10R10_USCALED_PACK32,
		VK_FORMAT_R16_UNORM,
		VK_FORMAT_R16_SNORM,
		VK_FORMAT_R16_USCALED,
		VK_FORMAT_R16_SSCALED,
		VK_FORMAT_R16_UINT,
		VK_FORMAT_R16_SINT,
		VK_FORMAT_R16_SFLOAT,
		VK_FORMAT_R16G16_UNORM,
		VK_FORMAT_R16G16_SNORM,
		VK_FORMAT_R16G16_USCALED,
		VK_FORMAT_R16G16_SSCALED,
		VK_FORMAT_R16G16_UINT,
		VK_FORMAT_R16G16_SINT,
		VK_FORMAT_R16G16_SFLOAT,
		VK_FORMAT_R16G16B16_UNORM,
		VK_FORMAT_R16G16B16_SNORM,
		VK_FORMAT_R16G16B16_USCALED,
		VK_FORMAT_R16G16B16_SSCALED,
		VK_FORMAT_R16G16B16_UINT,
		VK_FORMAT_R16G16B16_SINT,
		VK_FORMAT_R16G16B16_SFLOAT,
		VK_FORMAT_R16G16B16A16_UNORM,
		VK_FORMAT_R16G16B16A16_SNORM,
		VK_FORMAT_R16G16B16A16_USCALED,
		VK_FORMAT_R16G16B16A16_SSCALED,
		VK_FORMAT_R16G16B16A16_UINT,
		VK_FORMAT_R16G16B16A16_SINT,
		VK_FORMAT_R16G16B16A16_SFLOAT,
		VK_FORMAT_R32_UINT,
		VK_FORMAT_R32_SINT,
		VK_FORMAT_R32_SFLOAT,
		VK_FORMAT_R32G32_UINT,
		VK_FORMAT_R32G32_SINT,
		VK_FORMAT_R32G32_SFLOAT,
		VK_FORMAT_R32G32B32_UINT,
		VK_FORMAT_R32G32B32_SINT,
		VK_FORMAT_R32G32B32_SFLOAT,
		VK_FORMAT_R32G32B32A32_UINT,
		VK_FORMAT_R32G32B32A32_SINT,
		VK_FORMAT_R32G32B32A32_SFLOAT,
		VK_FORMAT_B10G11R11_UFLOAT_PACK32,
		VK_FORMAT_E5B9G9R9_UFLOAT_PACK32,
		VK_FORMAT_B4G4R4A4_UNORM_PACK16,
		VK_FORMAT_B5G5R5A1_UNORM_PACK16,

		// Compressed formats
		VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK,
		VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK,
		VK_FORMAT_EAC_R11_UNORM_BLOCK,
		VK_FORMAT_EAC_R11_SNORM_BLOCK,
		VK_FORMAT_EAC_R11G11_UNORM_BLOCK,
		VK_FORMAT_EAC_R11G11_SNORM_BLOCK,
		VK_FORMAT_ASTC_4x4_UNORM_BLOCK,
		VK_FORMAT_ASTC_4x4_SRGB_BLOCK,
		VK_FORMAT_ASTC_5x4_UNORM_BLOCK,
		VK_FORMAT_ASTC_5x4_SRGB_BLOCK,
		VK_FORMAT_ASTC_5x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_5x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_6x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_6x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_6x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_6x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_8x8_UNORM_BLOCK,
		VK_FORMAT_ASTC_8x8_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x5_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x5_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x6_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x6_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x8_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x8_SRGB_BLOCK,
		VK_FORMAT_ASTC_10x10_UNORM_BLOCK,
		VK_FORMAT_ASTC_10x10_SRGB_BLOCK,
		VK_FORMAT_ASTC_12x10_UNORM_BLOCK,
		VK_FORMAT_ASTC_12x10_SRGB_BLOCK,
		VK_FORMAT_ASTC_12x12_UNORM_BLOCK,
		VK_FORMAT_ASTC_12x12_SRGB_BLOCK,
	};

	de::MovePtr<tcu::TestCaseGroup> imageTests			(new tcu::TestCaseGroup(testCtx, "image_view", "Image tests"));
	de::MovePtr<tcu::TestCaseGroup> viewTypeTests		(new tcu::TestCaseGroup(testCtx, "view_type", ""));

	for (int viewTypeNdx = 0; viewTypeNdx < DE_LENGTH_OF_ARRAY(imageViewTypes); viewTypeNdx++)
	{
		const VkImageViewType			viewType		= imageViewTypes[viewTypeNdx].type;
		de::MovePtr<tcu::TestCaseGroup>	viewTypeGroup	(new tcu::TestCaseGroup(testCtx, imageViewTypes[viewTypeNdx].name, (std::string("Uses a ") + imageViewTypes[viewTypeNdx].name + " view").c_str()));
		de::MovePtr<tcu::TestCaseGroup>	formatTests		(new tcu::TestCaseGroup(testCtx, "format", "Uses samplable formats"));

		for (size_t formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
		{
			const VkFormat		format		= formats[formatNdx];

			if (isCompressedFormat(format))
			{
				// Do not use compressed formats with 1D and 1D array textures.
				if (viewType == VK_IMAGE_VIEW_TYPE_1D || viewType == VK_IMAGE_VIEW_TYPE_1D_ARRAY)
					break;
			}

			de::MovePtr<tcu::TestCaseGroup>	formatGroup	(new tcu::TestCaseGroup(testCtx,
																				getFormatCaseName(format).c_str(),
																				(std::string("Samples a texture of format ") + getFormatName(format)).c_str()));

			de::MovePtr<tcu::TestCaseGroup>	subresourceRangeTests	= createSubresourceRangeTests(testCtx, viewType, format);
			de::MovePtr<tcu::TestCaseGroup>	componentSwizzleTests	= createComponentSwizzleTests(testCtx, viewType, format);

			formatGroup->addChild(componentSwizzleTests.release());
			formatGroup->addChild(subresourceRangeTests.release());
			formatTests->addChild(formatGroup.release());
		}

		viewTypeGroup->addChild(formatTests.release());
		viewTypeTests->addChild(viewTypeGroup.release());
	}

	imageTests->addChild(viewTypeTests.release());

	return imageTests.release();
}